

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlGenerator.cpp
# Opt level: O3

void __thiscall YamlGenerator::generate(YamlGenerator *this,ostream *output,ScName *stmName)

{
  ScModel *pSVar1;
  ostream *poVar2;
  size_t sVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_node_base *p_Var5;
  _Base_ptr p_Var6;
  ScRegion *region;
  _Base_ptr p_Var7;
  char *pcVar8;
  _Base_ptr p_Var9;
  char *local_60;
  char *local_58;
  char local_50;
  undefined7 uStack_4f;
  _Rb_tree_node_base *local_40;
  _Base_ptr local_38;
  
  pSVar1 = (this->super_AbstractGenerator).m_model;
  if (stmName->_M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (output,"Note: discarding a state-machine name\n",0x26);
  }
  p_Var6 = (pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(pSVar1->m_states)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var6 != local_40) {
    do {
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (output,*(char **)(p_Var6 + 1),(long)p_Var6[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,":\n",2);
      if (p_Var6[2]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  parent: ",10);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,*(char **)(p_Var6 + 2),(long)p_Var6[2]._M_parent);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      if (p_Var6[3]._M_color != _S_red) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  history:\n",0xb);
        std::__ostream_insert<char,std::char_traits<char>>(output,"    mode: ",10);
        pcVar8 = "";
        if ((ulong)p_Var6[3]._M_color < 4) {
          pcVar8 = (&PTR_anon_var_dwarf_b12f5_00126ce8)[p_Var6[3]._M_color];
        }
        sVar3 = strlen(pcVar8);
        std::__ostream_insert<char,std::char_traits<char>>(output,pcVar8,sVar3);
        std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(output,"    initial: ",0xd);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (output,(char *)p_Var6[3]._M_parent,(long)p_Var6[3]._M_left);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      }
      p_Var7 = p_Var6[4]._M_parent;
      p_Var9 = p_Var6[4]._M_left;
      if (p_Var7 != p_Var9) {
        local_60 = &local_50;
        local_58 = (char *)0x0;
        local_50 = '\0';
        if (1 < (ulong)(((long)p_Var9 - (long)p_Var7 >> 4) * -0x3333333333333333)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"  regions:\n",0xb);
          std::__cxx11::string::_M_replace((ulong)&local_60,0,local_58,0x11c246);
          p_Var7 = p_Var6[4]._M_parent;
          p_Var9 = p_Var6[4]._M_left;
        }
        local_38 = p_Var9;
        if (p_Var7 != p_Var9) {
          do {
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,local_60,(long)local_58);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  initial: ",0xb);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar2,*(char **)p_Var7,(long)p_Var7->_M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,local_60,(long)local_58);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"  substates:\n",0xd);
            for (p_Var4 = p_Var7[1]._M_right; p_Var4 != (_Rb_tree_node_base *)&p_Var7[1]._M_parent;
                p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                 (output,local_60,(long)local_58);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    - ",6);
              poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar2,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
              std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
            }
            p_Var7 = (_Base_ptr)&p_Var7[2]._M_left;
          } while (p_Var7 != local_38);
        }
        if (local_60 != &local_50) {
          operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
        }
      }
      if (p_Var6[6]._M_parent != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  transitions:\n",0xf);
        for (p_Var4 = p_Var6[5]._M_right; p_Var4 != (_Rb_tree_node_base *)&p_Var6[5]._M_parent;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"    - target: ",0xe);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          if (p_Var4[2]._M_color != _S_red) {
            std::__ostream_insert<char,std::char_traits<char>>(output,"      history: ",0xf);
            pcVar8 = "";
            if ((ulong)p_Var4[2]._M_color < 4) {
              pcVar8 = (&PTR_anon_var_dwarf_b12f5_00126ce8)[p_Var4[2]._M_color];
            }
            sVar3 = strlen(pcVar8);
            std::__ostream_insert<char,std::char_traits<char>>(output,pcVar8,sVar3);
            std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
          }
          std::__ostream_insert<char,std::char_traits<char>>(output,"      events:\n",0xe);
          for (p_Var5 = *(_Rb_tree_node_base **)(p_Var4 + 3);
              p_Var5 != (_Rb_tree_node_base *)&p_Var4[2]._M_left;
              p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
            std::__ostream_insert<char,std::char_traits<char>>(output,"        - ",10);
            poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                               (output,*(char **)(p_Var5 + 1),(long)p_Var5[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
          }
        }
      }
      if (p_Var6[7]._M_right != (_Base_ptr)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(output,"  deferrals:\n",0xd);
        for (p_Var4 = p_Var6[7]._M_parent; p_Var4 != (_Rb_tree_node_base *)&p_Var6[6]._M_right;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          std::__ostream_insert<char,std::char_traits<char>>(output,"    - ",6);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             (output,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>(output,"\n",1);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while (p_Var6 != local_40);
  }
  std::ostream::flush();
  return;
}

Assistant:

void YamlGenerator::generate(std::ostream &output, const ScName &stmName)
{
    const auto &states = m_model.states();

    if (!stmName.empty()) {
        output << "Note: discarding a state-machine name\n";
    }

    for (const auto &[name, state] : states) {
        output << name << ":\n";
        if (state.isDefined()) {
            output << "  parent: " << state.parent << "\n";
        }

        print(output, state.historyState);
        print(output, state.regions);
        print(output, state.transitions);
        print(output, state.deferrals);

        output << "\n";
    }

    output.flush();
}